

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkers.cpp
# Opt level: O1

int message_height_proc(Am_Object *self)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Am_Value *pAVar4;
  Am_Object AStack_48;
  Am_Object local_40;
  Am_Object local_38;
  Am_Object local_30;
  Am_Object local_28;
  Am_Object local_20;
  
  Am_Object::Get_Object((ushort)&local_20,(ulong)self);
  Am_Object::Get_Object((ushort)&local_28,(ulong)&local_20);
  pAVar4 = (Am_Value *)Am_Object::Get((ushort)&local_28,0x67);
  iVar1 = Am_Value::operator_cast_to_int(pAVar4);
  Am_Object::Get_Object((ushort)&local_38,(ulong)self);
  Am_Object::Get_Object((ushort)&local_30,(ulong)&local_38);
  pAVar4 = (Am_Value *)Am_Object::Get((ushort)&local_30,0x67);
  iVar2 = Am_Value::operator_cast_to_int(pAVar4);
  Am_Object::Get_Object((ushort)&AStack_48,(ulong)self);
  Am_Object::Get_Object((ushort)&local_40,(ulong)&AStack_48);
  pAVar4 = (Am_Value *)Am_Object::Get((ushort)&local_40,0x67);
  iVar3 = Am_Value::operator_cast_to_int(pAVar4);
  Am_Object::~Am_Object(&local_40);
  Am_Object::~Am_Object(&AStack_48);
  Am_Object::~Am_Object(&local_30);
  Am_Object::~Am_Object(&local_38);
  Am_Object::~Am_Object(&local_28);
  Am_Object::~Am_Object(&local_20);
  return iVar1 + iVar2 + iVar3 + 0x28;
}

Assistant:

Am_Define_Formula(int, message_height)
{
  return 40 + (int)self.Get_Object(BOARD).Get_Object(TEXT1).Get(Am_HEIGHT) +
         (int)self.Get_Object(BOARD).Get_Object(TEXT2).Get(Am_HEIGHT) +
         (int)self.Get_Object(BOARD).Get_Object(CIRCLE).Get(Am_HEIGHT);
}